

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O1

RealType __thiscall
OpenMD::GofRTheta::evaluateAngle(GofRTheta *this,StuntDouble *sd1,StuntDouble *sd2)

{
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  char cVar4;
  double dVar5;
  bool bVar6;
  uint i_1;
  double **ppdVar7;
  uint i;
  long lVar8;
  double **ppdVar9;
  long lVar10;
  double (*padVar11) [3];
  undefined4 uVar12;
  double tmp;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Vector<double,_3U> result_2;
  Vector3d vec;
  Vector<double,_3U> result;
  MultipoleAdapter ma1;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Vector3d local_118;
  double *local_f8;
  double dStack_f0;
  double local_e8 [8];
  double local_a8 [4];
  double local_88 [4];
  MultipoleAdapter local_68;
  double local_60 [9];
  
  cVar4 = (((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  lVar8 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
  local_88[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)sd1->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)sd1->localIndex_ * 0x18);
  local_88[0] = *pdVar1;
  local_88[1] = pdVar1[1];
  lVar8 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
  local_a8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)sd2->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)sd2->localIndex_ * 0x18);
  local_a8[0] = *pdVar1;
  local_a8[1] = pdVar1[1];
  local_f8 = (double *)0x0;
  dStack_f0 = 0.0;
  local_e8[0] = 0.0;
  lVar8 = 0;
  do {
    (&local_f8)[lVar8] = (double *)(local_a8[lVar8] - local_88[lVar8]);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_118.super_Vector<double,_3U>.data_[2] = local_e8[0];
  local_118.super_Vector<double,_3U>.data_[0] = (double)local_f8;
  local_118.super_Vector<double,_3U>.data_[1] = dStack_f0;
  if (cVar4 != '\0') {
    Snapshot::wrapVector((this->super_GofRAngle).super_RadialDistrFunc.currentSnapshot_,&local_118);
  }
  dVar5 = 0.0;
  lVar8 = 0;
  do {
    dVar3 = local_118.super_Vector<double,_3U>.data_[lVar8];
    dVar5 = dVar5 + dVar3 * dVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  lVar8 = 0;
  do {
    local_118.super_Vector<double,_3U>.data_[lVar8] =
         local_118.super_Vector<double,_3U>.data_[lVar8] / dVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  if (1 < sd1->objType_ - otDAtom) {
    (*sd1->_vptr_StuntDouble[7])(&local_f8,sd1);
    snprintf(painCave.errMsg,2000,"GofRTheta: attempted to use a non-directional object: %s\n");
    if (local_f8 != local_e8) {
      operator_delete(local_f8,(long)local_e8[0] + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  if (sd1->objType_ < otRigidBody) {
    local_68.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    bVar6 = MultipoleAdapter::isDipole(&local_68);
    if (bVar6) {
      lVar8 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
      local_128 = *(undefined8 *)(lVar8 + 0x10 + (long)sd1->localIndex_ * 0x18);
      puVar2 = (undefined4 *)(lVar8 + (long)sd1->localIndex_ * 0x18);
      uVar12 = *puVar2;
      uVar13 = puVar2[1];
      uVar14 = puVar2[2];
      uVar15 = puVar2[3];
      goto LAB_00139211;
    }
    padVar11 = (double (*) [3])local_60;
    StuntDouble::getA((RotMat3x3d *)padVar11,sd1);
    ppdVar7 = &local_f8;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_f8 = (double *)0x0;
    dStack_f0 = 0.0;
    local_e8[6] = 0.0;
    lVar8 = 0;
    do {
      lVar10 = 0;
      ppdVar9 = ppdVar7;
      do {
        *ppdVar9 = (double *)
                   (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar10];
        lVar10 = lVar10 + 1;
        ppdVar9 = ppdVar9 + 3;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      ppdVar7 = ppdVar7 + 1;
      padVar11 = padVar11 + 1;
    } while (lVar8 != 3);
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    ppdVar7 = &local_f8;
    lVar8 = 0;
    do {
      dVar5 = (double)(&local_158)[lVar8];
      lVar10 = 0;
      do {
        dVar5 = dVar5 + *(double *)((long)ppdVar7 + lVar10) *
                        *(double *)((long)&OpenMD::V3Z + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      (&local_158)[lVar8] = dVar5;
      lVar8 = lVar8 + 1;
      ppdVar7 = ppdVar7 + 3;
    } while (lVar8 != 3);
  }
  else {
    padVar11 = (double (*) [3])local_60;
    StuntDouble::getA((RotMat3x3d *)padVar11,sd1);
    ppdVar7 = &local_f8;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_f8 = (double *)0x0;
    dStack_f0 = 0.0;
    local_e8[6] = 0.0;
    lVar8 = 0;
    do {
      lVar10 = 0;
      ppdVar9 = ppdVar7;
      do {
        *ppdVar9 = (double *)
                   (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar10];
        lVar10 = lVar10 + 1;
        ppdVar9 = ppdVar9 + 3;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      ppdVar7 = ppdVar7 + 1;
      padVar11 = padVar11 + 1;
    } while (lVar8 != 3);
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    ppdVar7 = &local_f8;
    lVar8 = 0;
    do {
      dVar5 = (double)(&local_158)[lVar8];
      lVar10 = 0;
      do {
        dVar5 = dVar5 + *(double *)((long)ppdVar7 + lVar10) *
                        *(double *)((long)&OpenMD::V3Z + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      (&local_158)[lVar8] = dVar5;
      lVar8 = lVar8 + 1;
      ppdVar7 = ppdVar7 + 3;
    } while (lVar8 != 3);
  }
  local_128 = local_148;
  uVar12 = (undefined4)local_158;
  uVar13 = local_158._4_4_;
  uVar14 = (undefined4)uStack_150;
  uVar15 = uStack_150._4_4_;
LAB_00139211:
  local_138 = CONCAT44(uVar13,uVar12);
  uStack_130 = CONCAT44(uVar15,uVar14);
  dVar5 = 0.0;
  lVar8 = 0;
  do {
    dVar5 = dVar5 + (double)(&local_138)[lVar8] * (double)(&local_138)[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  lVar8 = 0;
  do {
    (&local_138)[lVar8] = (double)(&local_138)[lVar8] / dVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  dVar5 = 0.0;
  lVar8 = 0;
  do {
    dVar5 = dVar5 + local_118.super_Vector<double,_3U>.data_[lVar8] * (double)(&local_138)[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  return dVar5;
}

Assistant:

RealType GofRTheta::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;

    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    r12.normalize();

    Vector3d vec;

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRTheta: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd1->isAtom()) {
      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      if (ma1.isDipole())
        vec = sd1->getDipole();
      else
        vec = sd1->getA().transpose() * V3Z;
    } else {
      vec = sd1->getA().transpose() * V3Z;
    }

    vec.normalize();

    return dot(r12, vec);
  }